

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exception.c++
# Opt level: O3

StringPtr __thiscall kj::trimSourceFilename(kj *this,StringPtr filename)

{
  char *__s;
  int iVar1;
  char *__n;
  long lVar2;
  char *pcVar3;
  StringPtr SVar4;
  char *local_48;
  kj *local_40;
  char *local_38;
  
  local_48 = (char *)0x1;
  local_38 = filename.content.ptr + -1;
  pcVar3 = filename.content.ptr;
  local_40 = this;
  if (local_38 != (char *)0x0) {
LAB_0019e29c:
    local_48 = pcVar3;
    pcVar3 = (char *)0x0;
    do {
      if ((pcVar3 == (char *)0x0) || ((pcVar3 + -1)[(long)local_40] == '/')) {
        lVar2 = 0;
        do {
          __s = *(char **)((long)trimSourceFilename::ROOTS + lVar2);
          __n = (char *)strlen(__s);
          if ((__n <= local_48 + ~(ulong)pcVar3) &&
             ((__n == (char *)0x0 ||
              (iVar1 = bcmp(local_40 + (long)pcVar3,__s,(size_t)__n), iVar1 == 0)))) {
            local_40 = local_40 + (long)(__n + (long)pcVar3);
            local_38 = local_48 + -(long)(__n + (long)pcVar3) + -1;
            pcVar3 = local_48 + -(long)(__n + (long)pcVar3);
            if (local_38 != (char *)0x0) goto LAB_0019e29c;
            local_48 = (char *)0x1;
            goto LAB_0019e33b;
          }
          lVar2 = lVar2 + 8;
        } while (lVar2 != 0x20);
      }
      pcVar3 = pcVar3 + 1;
    } while (pcVar3 != local_38);
  }
LAB_0019e33b:
  SVar4.content.size_ = (size_t)local_48;
  SVar4.content.ptr = (char *)local_40;
  return (StringPtr)SVar4.content;
}

Assistant:

kj::StringPtr trimSourceFilename(kj::StringPtr filename) {
  // Removes noisy prefixes from source code file name.
  //
  // The goal here is to produce the "canonical" filename given the filename returned by e.g.
  // addr2line. addr2line gives us the full path of the file as passed on the compiler
  // command-line, which in turn is affected by build system and by whether and where we're
  // performing an out-of-tree build.
  //
  // To deal with all this, we look for directory names in the path which we recognize to be
  // locations that represent roots of the source tree. We strip said root and everything before
  // it.
  //
  // On Windows, we often get filenames containing backslashes. Since we aren't allowed to allocate
  // a new string here, we can't do much about this, so our returned "canonical" name will
  // unfortunately end up with backslashes.

  static constexpr const char* ROOTS[] = {
    "ekam-provider/canonical/",  // Ekam source file.
    "ekam-provider/c++header/",  // Ekam include file.
    "src/",                      // Non-Ekam source root.
    "tmp/",                      // Non-Ekam generated code.
#if _WIN32
    "src\\",                     // Win32 source root.
    "tmp\\",                     // Win32 generated code.
#endif
  };

retry:
  for (size_t i: kj::indices(filename)) {
    if (i == 0 || filename[i-1] == '/'
#if _WIN32
               || filename[i-1] == '\\'
#endif
        ) {
      // We're at the start of a directory name. Check for valid prefixes.
      for (kj::StringPtr root: ROOTS) {
        if (filename.slice(i).startsWith(root)) {
          filename = filename.slice(i + root.size());

          // We should keep searching to find the last instance of a root name. `i` is no longer
          // a valid index for `filename` so start the loop over.
          goto retry;
        }
      }
    }
  }

  return filename;
}